

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int mbedtls_pk_load_file(char *path,uchar **buf,size_t *n)

{
  FILE *__stream;
  size_t sVar1;
  uchar *__ptr;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  
  __stream = fopen(path,"rb");
  iVar4 = -0x3e00;
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar1 = ftell(__stream);
    if (sVar1 == 0xffffffffffffffff) {
      fclose(__stream);
    }
    else {
      fseek(__stream,0,0);
      *n = sVar1;
      __ptr = (uchar *)calloc(1,sVar1 + 1);
      *buf = __ptr;
      if (__ptr == (uchar *)0x0) {
        fclose(__stream);
        iVar4 = -0x3f80;
      }
      else {
        sVar2 = fread(__ptr,1,sVar1,__stream);
        sVar1 = *n;
        fclose(__stream);
        if (sVar2 == sVar1) {
          (*buf)[*n] = '\0';
          pcVar3 = strstr((char *)*buf,"-----BEGIN ");
          iVar4 = 0;
          if (pcVar3 != (char *)0x0) {
            *n = *n + 1;
            iVar4 = 0;
          }
        }
        else {
          free(*buf);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_pk_load_file( const char *path, unsigned char **buf, size_t *n )
{
    FILE *f;
    long size;

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_PK_FILE_IO_ERROR );

    fseek( f, 0, SEEK_END );
    if( ( size = ftell( f ) ) == -1 )
    {
        fclose( f );
        return( MBEDTLS_ERR_PK_FILE_IO_ERROR );
    }
    fseek( f, 0, SEEK_SET );

    *n = (size_t) size;

    if( *n + 1 == 0 ||
        ( *buf = mbedtls_calloc( 1, *n + 1 ) ) == NULL )
    {
        fclose( f );
        return( MBEDTLS_ERR_PK_ALLOC_FAILED );
    }

    if( fread( *buf, 1, *n, f ) != *n )
    {
        fclose( f );
        mbedtls_free( *buf );
        return( MBEDTLS_ERR_PK_FILE_IO_ERROR );
    }

    fclose( f );

    (*buf)[*n] = '\0';

    if( strstr( (const char *) *buf, "-----BEGIN " ) != NULL )
        ++*n;

    return( 0 );
}